

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

bool __thiscall FStateDefinitions::SetLoop(FStateDefinitions *this)

{
  bool bVar1;
  FStateDefinitions *this_local;
  
  bVar1 = this->laststate != (FState *)0x0;
  if (bVar1) {
    this->laststate->DefineFlags = '\x05';
    this->laststate->NextState = (FState *)(this->lastlabel + 1);
    this->laststatebeforelabel = (FState *)0x0;
  }
  return bVar1;
}

Assistant:

bool FStateDefinitions::SetLoop()
{
	if (laststate != NULL)
	{
		laststate->DefineFlags = SDF_INDEX;
		laststate->NextState = (FState*)(lastlabel+1);
		laststatebeforelabel = NULL;
		return true;
	}
	return false;
}